

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall
TasGrid::GridSequence::integrateHierarchicalFunctions(GridSequence *this,double *integrals)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> integ;
  
  lVar8 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = 0x40;
  }
  uVar1 = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar8);
  cacheBasisIntegrals(&integ,this);
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  uVar5 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    lVar3 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar8);
    lVar4 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar8);
    dVar10 = integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[*(int *)(lVar4 + lVar3 * uVar6 * 4)];
    for (lVar7 = 1; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      dVar10 = dVar10 * integ.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [*(int *)(lVar3 * uVar5 + lVar4 + lVar7 * 4)];
    }
    integrals[uVar6] = dVar10;
    uVar5 = uVar5 + 4;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&integ);
  return;
}

Assistant:

void GridSequence::integrateHierarchicalFunctions(double integrals[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int const num_points = work.getNumIndexes();
    std::vector<double> integ = cacheBasisIntegrals();
    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        double w = integ[p[0]];
        for(int j=1; j<num_dimensions; j++){
            w *= integ[p[j]];
        }
        integrals[i] = w;
    }
}